

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_saver_success_example.cpp
# Opt level: O1

void foo6(int *a)

{
  long *plVar1;
  
  *a = 1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"foo6 a = ",9);
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,*a);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"foo6 a = ",9);
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,*a);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  return;
}

Assistant:

void foo6(int& a) {
  WITH_SAVER_SUCCESS(a) {
    a = 1;
    std::cout << "foo6 a = " << a << std::endl;
    // Original state will automatically restored, on scope leave when no exceptions have been thrown.
  }

  std::cout << "foo6 a = " << a << std::endl;
}